

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

error_code llvm::sys::fs::createUniqueFile(Twine *Model,SmallVectorImpl<char> *ResultPath,uint Mode)

{
  bool bVar1;
  error_code eVar2;
  int local_30;
  uint local_2c;
  int FD;
  uint Mode_local;
  SmallVectorImpl<char> *ResultPath_local;
  Twine *Model_local;
  error_code EC;
  
  local_2c = Mode;
  _FD = ResultPath;
  ResultPath_local = (SmallVectorImpl<char> *)Model;
  eVar2 = createUniqueFile(Model,&local_30,ResultPath,Mode);
  EC._0_8_ = eVar2._M_cat;
  Model_local._0_4_ = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&Model_local);
  if (!bVar1) {
    close(local_30);
  }
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)Model_local;
  eVar2._M_cat = (error_category *)EC._0_8_;
  return eVar2;
}

Assistant:

std::error_code createUniqueFile(const Twine &Model,
                                 SmallVectorImpl<char> &ResultPath,
                                 unsigned Mode) {
  int FD;
  auto EC = createUniqueFile(Model, FD, ResultPath, Mode);
  if (EC)
    return EC;
  // FD is only needed to avoid race conditions. Close it right away.
  close(FD);
  return EC;
}